

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,tagbstring *x)

{
  uint uVar1;
  uchar *__dest;
  CBStringException *pCVar2;
  uint len;
  allocator local_99;
  CBStringException bstr__cppwrapper_exception;
  string local_70;
  string local_50;
  string local_30;
  
  uVar1 = (this->super_tagbstring).mlen;
  if ((int)uVar1 < 1) {
    std::__cxx11::string::string((string *)&local_30,"CBString::Write protection error",&local_99);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  len = x->slen;
  if (-1 < (int)len) {
    if (uVar1 <= len) {
      alloc(this,len);
      len = x->slen;
    }
    (this->super_tagbstring).slen = len;
    __dest = (this->super_tagbstring).data;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,x->data,(long)(int)len);
      (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
      return this;
    }
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    std::__cxx11::string::string
              ((string *)&local_70,"CBString::Failure in =(tagbstring) operator",&local_99);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  std::__cxx11::string::string
            ((string *)&local_50,
             "CBString::Failure in =(tagbstring) operator, badly formed tagbstring",&local_99);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (const tagbstring& x) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (x.slen < 0) bstringThrow ("Failure in =(tagbstring) operator, badly formed tagbstring");
	if (x.slen >= mlen) alloc (x.slen);

	slen = x.slen;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in =(tagbstring) operator");
	} else {
		bstr__memcpy (data, x.data, slen);
		data[slen] = '\0';
	}
	return *this;
}